

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::GenerateArgOutForInlineeStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  StackSym *stackSym;
  RegOpnd *dst;
  IndirOpnd *newSrc;
  Instr *this_01;
  IntConstOpnd *pIVar5;
  uint local_9c;
  uint i;
  Instr *argout;
  IndirOpnd *argIndirOpnd;
  AutoReuseOpnd autoReuseArgInOpnd;
  RegOpnd *argInOpnd;
  AutoReuseOpnd autoReuseFirstArg;
  SymOpnd *firstArg;
  StackSym *firstRealArgStackSym;
  uint32 actualCount;
  Func *func;
  Instr *stackArgsInstr_local;
  Instr *callInstr_local;
  Lowerer *this_local;
  
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548c,"(callInstr->m_func->IsInlinee())","callInstr->m_func->IsInlinee()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = callInstr->m_func;
  local_9c = this_00->actualCount - 1;
  if (0xe < local_9c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x548f,"(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                       "actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = Func::GetInlineeArgvSlotOpnd(this_00);
  stackSym = Sym::AsStackSym(pSVar4->m_sym);
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  autoReuseFirstArg._16_8_ = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&argInOpnd,(Opnd *)autoReuseFirstArg._16_8_,this_00,true);
  dst = IR::RegOpnd::New(TyInt64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&argIndirOpnd,&dst->super_Opnd,this_00,true);
  InsertLea(dst,(Opnd *)autoReuseFirstArg._16_8_,callInstr);
  for (; local_9c != 0; local_9c = local_9c - 1) {
    newSrc = IR::IndirOpnd::New(dst,local_9c * 8 + -8,TyInt64,this_00,false);
    this_01 = IR::Instr::New(ArgOut_A_Dynamic,this_00);
    IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(callInstr,this_01);
    LowererMD::LoadDynamicArgument(&this->m_lowererMD,this_01,local_9c + 3);
  }
  pIVar5 = IR::IntConstOpnd::New((ulong)this_00->actualCount,TyInt64,this_00,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&argIndirOpnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&argInOpnd);
  return &pIVar5->super_Opnd;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForInlineeStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{
    Assert(callInstr->m_func->IsInlinee());
    Func *func = callInstr->m_func;
    uint32 actualCount = func->actualCount - 1; // don't count this pointer
    Assert(actualCount < Js::InlineeCallInfo::MaxInlineeArgoutCount);

    const auto firstRealArgStackSym = func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, func);
    IR::RegOpnd* argInOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseArgInOpnd(argInOpnd, func);
    InsertLea(argInOpnd, firstArg, callInstr);

    IR::IndirOpnd *argIndirOpnd = nullptr;
    IR::Instr* argout = nullptr;

#if defined(_M_IX86)
    // Maintain alignment
    if ((actualCount & 1) == 0)
    {
        IR::Instr *alignPush = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
        alignPush->SetSrc1(IR::IntConstOpnd::New(1, TyInt32, this->m_func));
        callInstr->InsertBefore(alignPush);
    }
#endif

    for(uint i = actualCount; i > 0; i--)
    {
        argIndirOpnd = IR::IndirOpnd::New(argInOpnd, (i - 1) * MachPtr, TyMachReg, func);
        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(argIndirOpnd);
        callInstr->InsertBefore(argout);
        // i represents ith arguments from actuals, with is i + 3 counting this, callInfo and function object
        this->m_lowererMD.LoadDynamicArgument(argout, i + 3);
    }
    return IR::IntConstOpnd::New(func->actualCount, TyMachReg, func);
}